

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O1

shared_ptr<ghc::options::option_info> __thiscall
ghc::options::create_option
          (options *this,string *option,string *description,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *handler)

{
  size_type *this_00;
  ulong uVar1;
  pointer pcVar2;
  value_type *__x;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  size_type sVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_R8;
  undefined8 *puVar8;
  bool bVar9;
  shared_ptr<ghc::options::option_info> sVar10;
  type type;
  type local_54;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_54 = no_arg;
  if (description->_M_string_length < 3) goto LAB_00132ce9;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,anon_var_dwarf_a6db1 + 0x3fe5,anon_var_dwarf_a6db1 + 0x3fe6);
  uVar1 = description->_M_string_length;
  if (uVar1 < local_48) {
LAB_00132b65:
    puVar8 = (undefined8 *)0x0;
  }
  else {
    puVar8 = (undefined8 *)CONCAT71((int7)((ulong)&local_50 >> 8),local_48 == 0);
    if (local_48 != 0) {
      pcVar2 = (description->_M_dataplus)._M_p;
      if (*(char *)((long)local_50 + (local_48 - 1)) == pcVar2[uVar1 - 1]) {
        lVar6 = 0;
        do {
          bVar9 = 1 - local_48 == lVar6;
          puVar8 = (undefined8 *)CONCAT71((int7)((ulong)puVar8 >> 8),bVar9);
          if (bVar9) goto LAB_00132b68;
          lVar3 = lVar6 + (local_48 - 2);
          lVar4 = lVar6 + (uVar1 - 2);
          lVar6 = lVar6 + -1;
        } while (*(char *)((long)local_50 + lVar3) == pcVar2[lVar4]);
      }
      goto LAB_00132b65;
    }
  }
LAB_00132b68:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((char)puVar8 == '\0') {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"?","");
    uVar1 = description->_M_string_length;
    if (uVar1 < local_48) {
LAB_00132c03:
      puVar8 = (undefined8 *)0x0;
    }
    else {
      puVar8 = (undefined8 *)CONCAT71((int7)((ulong)&local_50 >> 8),local_48 == 0);
      if (local_48 != 0) {
        pcVar2 = (description->_M_dataplus)._M_p;
        if (*(char *)((long)local_50 + (local_48 - 1)) == pcVar2[uVar1 - 1]) {
          lVar6 = 0;
          do {
            bVar9 = 1 - local_48 == lVar6;
            puVar8 = (undefined8 *)CONCAT71((int7)((ulong)puVar8 >> 8),bVar9);
            if (bVar9) goto LAB_00132c06;
            lVar3 = lVar6 + (local_48 - 2);
            lVar4 = lVar6 + (uVar1 - 2);
            lVar6 = lVar6 + -1;
          } while (*(char *)((long)local_50 + lVar3) == pcVar2[lVar4]);
        }
        goto LAB_00132c03;
      }
    }
LAB_00132c06:
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if ((char)puVar8 == '\0') {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"!","");
      uVar1 = description->_M_string_length;
      if (uVar1 < local_48) {
LAB_00132caa:
        puVar8 = (undefined8 *)0x0;
      }
      else {
        puVar8 = (undefined8 *)CONCAT71((int7)((ulong)&local_50 >> 8),local_48 == 0);
        if (local_48 != 0) {
          pcVar2 = (description->_M_dataplus)._M_p;
          if (*(char *)((long)local_50 + (local_48 - 1)) == pcVar2[uVar1 - 1]) {
            lVar6 = 0;
            do {
              bVar9 = 1 - local_48 == lVar6;
              puVar8 = (undefined8 *)CONCAT71((int7)((ulong)puVar8 >> 8),bVar9);
              if (bVar9) goto LAB_00132cad;
              lVar3 = lVar6 + (local_48 - 2);
              lVar4 = lVar6 + (uVar1 - 2);
              lVar6 = lVar6 + -1;
            } while (*(char *)((long)local_50 + lVar3) == pcVar2[lVar4]);
          }
          goto LAB_00132caa;
        }
      }
LAB_00132cad:
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if ((char)puVar8 == '\0') goto LAB_00132ce9;
      local_54 = arg_needed;
    }
    else {
      local_54 = arg_optional;
    }
  }
  sVar7 = description->_M_string_length - 1;
  if (description->_M_string_length == 0) {
    uVar5 = std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase");
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar8 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar8);
    }
    _Unwind_Resume(uVar5);
  }
  description->_M_string_length = sVar7;
  (description->_M_dataplus)._M_p[sVar7] = '\0';
LAB_00132ce9:
  (this->_arg0)._M_dataplus._M_p = (pointer)0x0;
  this_00 = &(this->_arg0)._M_string_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ghc::options::option_info,std::allocator<ghc::options::option_info>,std::__cxx11::string&,std::__cxx11::string_const&,ghc::options::option_info::type&,std::function<void(std::__cxx11::string_const&)>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(option_info **)this,
             (allocator<ghc::options::option_info> *)&local_50,description,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)handler,&local_54,
             in_R8);
  pcVar2 = (this->_arg0)._M_dataplus._M_p;
  *(pointer *)(pcVar2 + 0x40) = pcVar2;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(pcVar2 + 0x48),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  __x = (value_type *)(this->_arg0)._M_dataplus._M_p;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&__x[3].field_2 + 8),__x);
  sVar10.super___shared_ptr<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar10.super___shared_ptr<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ghc::options::option_info>)
         sVar10.super___shared_ptr<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<option_info> create_option(std::string option, const std::string& description, std::function<void(const std::string&)> handler) const
    {
        option_info::type type = option_info::type::no_arg;
        if (option.length() > 2) {
            if (ends_with(option, " ")) {
                option.erase(option.length()-1);
            }
            else if (ends_with(option, "?")) {
                type = option_info::type::arg_optional;
                option.erase(option.length()-1);
            }
            else if (ends_with(option, "!")) {
                type = option_info::type::arg_needed;
                option.erase(option.length()-1);
            }
        }
        auto optinfo = std::make_shared<option_info>(option, description, type, handler);
        optinfo->_master = optinfo;
        optinfo->_variants.push_back(optinfo->_name);
        return optinfo;
    }